

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint_impl.hpp
# Opt level: O2

connection_ptr __thiscall
websocketpp::endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
::create_connection(endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                    *this)

{
  _Manager_type *__args_4;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  element_type *peVar4;
  basic<websocketpp::concurrency::basic,_websocketpp::log::elevel> *this_00;
  int iVar5;
  size_t in_RCX;
  element_type *__n;
  long *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  endpoint<websocketpp::config::asio::transport_config> *in_RSI;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  connection_ptr cVar8;
  connection_ptr con;
  __shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,(__gnu_cxx::_Lock_policy)2>
  local_1c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  __weak_ptr<void,(__gnu_cxx::_Lock_policy)2> local_1b0 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  connection_weak_ptr w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_190 [4];
  function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
  local_170;
  function<bool_(std::weak_ptr<void>)> local_150;
  function<void_(std::weak_ptr<void>)> local_130;
  function<void_(std::weak_ptr<void>)> local_110;
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_f0;
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_d0;
  function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_b0;
  function<void_(std::weak_ptr<void>)> local_90;
  function<void_(std::weak_ptr<void>)> local_70;
  function<void_(std::weak_ptr<void>)> local_50;
  
  log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
            (*(basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> **)
              &in_RSI[1].super_socket_type.m_socket_init_handler.super__Function_base._M_functor,
             0x400,"create_connection",in_RCX);
  __args_4 = &in_RSI[1].super_socket_type.m_socket_init_handler.super__Function_base._M_manager;
  local_190[0] = &in_RSI[2].m_work.
                  super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  std::
  make_shared<websocketpp::connection<websocketpp::config::asio>,bool_const&,std::__cxx11::string&,std::shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,websocketpp::log::alevel>>&,std::shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,websocketpp::log::elevel>>&,std::reference_wrapper<websocketpp::random::none::int_generator<unsigned_int>>>
            ((bool *)&con,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&in_RSI[2].m_work.
                     super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 1),
             (shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>_>
              *)&in_RSI[1].m_tcp_pre_bind_handler,
             (shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>_>
              *)(in_RSI + 1),
             (reference_wrapper<websocketpp::random::none::int_generator<unsigned_int>_> *)__args_4)
  ;
  std::__weak_ptr<websocketpp::connection<websocketpp::config::asio>,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<websocketpp::connection<websocketpp::config::asio>,void>
            ((__weak_ptr<websocketpp::connection<websocketpp::config::asio>,(__gnu_cxx::_Lock_policy)2>
              *)&w.
                 super___weak_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
             ,&con.
               super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
            );
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__weak_ptr<void,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<websocketpp::connection<websocketpp::config::asio>,void>
            (local_1b0,
             &w.
              super___weak_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
            );
  connection<websocketpp::config::asio>::set_handle(peVar6,(connection_hdl *)local_1b0);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_1a8);
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::function<void_(std::weak_ptr<void>)>::function(&local_50,&in_RSI[1].m_tcp_pre_init_handler);
  std::function<void_(std::weak_ptr<void>)>::operator=(&peVar6->m_open_handler,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::function<void_(std::weak_ptr<void>)>::function(&local_70,&in_RSI[1].m_tcp_post_init_handler);
  std::function<void_(std::weak_ptr<void>)>::operator=(&peVar6->m_close_handler,&local_70);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::function<void_(std::weak_ptr<void>)>::function
            (&local_90,(function<void_(std::weak_ptr<void>)> *)&in_RSI[1].m_io_service);
  std::function<void_(std::weak_ptr<void>)>::operator=(&peVar6->m_fail_handler,&local_90);
  std::_Function_base::~_Function_base(&local_90.super__Function_base);
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::
  function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_b0,
             (function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&in_RSI[1].m_resolver);
  std::
  function<bool_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::operator=(&peVar6->m_ping_handler,&local_b0);
  std::_Function_base::~_Function_base(&local_b0.super__Function_base);
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_d0,
             (function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&in_RSI[1].m_listen_backlog);
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::operator=(&peVar6->m_pong_handler,&local_d0);
  std::_Function_base::~_Function_base(&local_d0.super__Function_base);
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_f0,
             (function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)&in_RSI[1].m_alog.
                 super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount);
  std::
  function<void_(std::weak_ptr<void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::operator=(&peVar6->m_pong_timeout_handler,&local_f0);
  std::_Function_base::~_Function_base(&local_f0.super__Function_base);
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::function<void_(std::weak_ptr<void>)>::function
            (&local_110,
             (function<void_(std::weak_ptr<void>)> *)
             &in_RSI[2].super_socket_type.m_socket_init_handler.super__Function_base._M_manager);
  std::function<void_(std::weak_ptr<void>)>::operator=(&peVar6->m_interrupt_handler,&local_110);
  std::_Function_base::~_Function_base(&local_110.super__Function_base);
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::function<void_(std::weak_ptr<void>)>::function
            (&local_130,
             (function<void_(std::weak_ptr<void>)> *)
             &in_RSI[2].m_tcp_pre_bind_handler.super__Function_base._M_manager);
  std::function<void_(std::weak_ptr<void>)>::operator=(&peVar6->m_http_handler,&local_130);
  std::_Function_base::~_Function_base(&local_130.super__Function_base);
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::function<bool_(std::weak_ptr<void>)>::function
            (&local_150,
             (function<bool_(std::weak_ptr<void>)> *)
             &in_RSI[2].m_tcp_pre_init_handler.super__Function_base._M_manager);
  std::function<bool_(std::weak_ptr<void>)>::operator=(&peVar6->m_validate_handler,&local_150);
  std::_Function_base::~_Function_base(&local_150.super__Function_base);
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::
  function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
  ::function(&local_170,
             (function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
              *)&in_RSI[2].m_tcp_post_init_handler.super__Function_base._M_manager);
  std::
  function<void_(std::weak_ptr<void>,_std::shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>)>
  ::operator=(&peVar6->m_message_handler,&local_170);
  std::_Function_base::~_Function_base(&local_170.super__Function_base);
  peVar1 = in_RSI[2].m_acceptor.
           super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x1388) {
    (con.
     super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr)->m_open_handshake_timeout_dur = (long)peVar1;
  }
  p_Var2 = in_RSI[2].m_acceptor.
           super___shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1388) {
    (con.
     super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr)->m_close_handshake_timeout_dur = (long)p_Var2;
  }
  peVar3 = in_RSI[2].m_resolver.
           super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar3 != (element_type *)0x1388) {
    (con.
     super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr)->m_pong_timeout_dur = (long)peVar3;
  }
  p_Var2 = in_RSI[2].m_resolver.
           super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(tot + 0x1c6bbf0)) {
    (con.
     super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr)->m_max_message_size = (size_t)p_Var2;
    peVar4 = ((con.
               super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->m_processor).
             super___shared_ptr<websocketpp::processor::processor<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar4 != (element_type *)0x0) {
      peVar4->m_max_message_size = (size_t)p_Var2;
    }
  }
  __n = in_RSI[2].m_work.super___shared_ptr<asio::io_context::work,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr;
  ((con.
    super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->m_request).super_parser.m_body_bytes_max = (size_t)__n;
  std::
  __shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>,(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr<websocketpp::connection<websocketpp::config::asio>,void>
            (local_1c0,
             &con.
              super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
            );
  iVar5 = transport::asio::endpoint<websocketpp::config::asio::transport_config>::init
                    (in_RSI,(EVP_PKEY_CTX *)local_1c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8);
  _Var7 = con.
          super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  peVar6 = con.
           super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (iVar5 == 0) {
    con.
    super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    con.
    super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
  }
  else {
    this_00 = (basic<websocketpp::concurrency::basic,_websocketpp::log::elevel> *)*__args_4;
    (**(code **)(*extraout_RDX + 0x20))(local_190,extraout_RDX,iVar5);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              (this_00,0x20,local_190,(size_t)__n);
    std::__cxx11::string::~string((string *)local_190);
    peVar6 = (element_type *)0x0;
    _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  *(element_type **)
   &(this->super_transport_type).super_socket_type.m_socket_init_handler.super__Function_base.
    _M_functor = peVar6;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   ((long)&(this->super_transport_type).super_socket_type.m_socket_init_handler.super__Function_base
           ._M_functor + 8) = _Var7._M_pi;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&w.
              super___weak_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&con.
              super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  cVar8.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX_00._M_pi;
  cVar8.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (connection_ptr)
         cVar8.
         super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

typename endpoint<connection,config>::connection_ptr
endpoint<connection,config>::create_connection() {
    m_alog->write(log::alevel::devel,"create_connection");
    //scoped_lock_type lock(m_state_lock);

    /*if (m_state == STOPPING || m_state == STOPPED) {
        return connection_ptr();
    }*/

    //scoped_lock_type guard(m_mutex);
    // Create a connection on the heap and manage it using a shared pointer
    connection_ptr con = lib::make_shared<connection_type>(m_is_server,
        m_user_agent, m_alog, m_elog, lib::ref(m_rng));

    connection_weak_ptr w(con);

    // Create a weak pointer on the heap using that shared_ptr.
    // Cast that weak pointer to void* and manage it using another shared_ptr
    // connection_hdl hdl(reinterpret_cast<void*>(new connection_weak_ptr(con)));

    con->set_handle(w);

    // Copy default handlers from the endpoint
    con->set_open_handler(m_open_handler);
    con->set_close_handler(m_close_handler);
    con->set_fail_handler(m_fail_handler);
    con->set_ping_handler(m_ping_handler);
    con->set_pong_handler(m_pong_handler);
    con->set_pong_timeout_handler(m_pong_timeout_handler);
    con->set_interrupt_handler(m_interrupt_handler);
    con->set_http_handler(m_http_handler);
    con->set_validate_handler(m_validate_handler);
    con->set_message_handler(m_message_handler);

    if (m_open_handshake_timeout_dur != config::timeout_open_handshake) {
        con->set_open_handshake_timeout(m_open_handshake_timeout_dur);
    }
    if (m_close_handshake_timeout_dur != config::timeout_close_handshake) {
        con->set_close_handshake_timeout(m_close_handshake_timeout_dur);
    }
    if (m_pong_timeout_dur != config::timeout_pong) {
        con->set_pong_timeout(m_pong_timeout_dur);
    }
    if (m_max_message_size != config::max_message_size) {
        con->set_max_message_size(m_max_message_size);
    }
    con->set_max_http_body_size(m_max_http_body_size);

    lib::error_code ec;

    ec = transport_type::init(con);
    if (ec) {
        m_elog->write(log::elevel::fatal,ec.message());
        return connection_ptr();
    }

    return con;
}